

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.h
# Opt level: O3

uint GetVirtualIndex(PClass *cls,char *funcname)

{
  DObject *p;
  PFunction *pPVar1;
  FName local_c;
  
  local_c.Index = FName::NameManager::FindName(&FName::NameData,funcname,false);
  p = (DObject *)
      PSymbolTable::FindSymbol
                (&(cls->super_PNativeStruct).super_PStruct.super_PNamedType.super_PCompoundType.
                  super_PType.Symbols,&local_c,false);
  pPVar1 = dyn_cast<PFunction>(p);
  if (pPVar1 != (PFunction *)0x0) {
    return ((pPVar1->Variants).Array)->Implementation->VirtualIndex;
  }
  __assert_fail("sym != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/virtual.h"
                ,5,"unsigned int GetVirtualIndex(PClass *, const char *)");
}

Assistant:

inline unsigned GetVirtualIndex(PClass *cls, const char *funcname)
{
	// Look up the virtual function index in the defining class because this may have gotten overloaded in subclasses with something different than a virtual override.
	auto sym = dyn_cast<PFunction>(cls->Symbols.FindSymbol(funcname, false));
	assert(sym != nullptr);
	auto VIndex = sym->Variants[0].Implementation->VirtualIndex;
	return VIndex;
}